

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O3

void TIFFSwabArrayOfTriples(uint8_t *tp,tmsize_t n)

{
  uint8_t uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  if (0 < n) {
    puVar3 = tp + 2;
    uVar2 = n + 1;
    do {
      uVar1 = *puVar3;
      *puVar3 = puVar3[-2];
      puVar3[-2] = uVar1;
      puVar3 = puVar3 + 3;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void TIFFSwabArrayOfTriples(register uint8_t *tp, tmsize_t n)
{
    unsigned char *cp;
    unsigned char t;

    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)tp;
        t = cp[2];
        cp[2] = cp[0];
        cp[0] = t;
        tp += 3;
    }
}